

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_utter_heal(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int sn_00;
  char *txt;
  
  bVar1 = is_evil(ch);
  if (bVar1) {
    txt = "The Gods of darkness do not grant such beneficial spells to their clerics.\n\r";
    goto LAB_002ba89d;
  }
  iVar2 = skill_lookup("atrophy");
  sn_00 = skill_lookup("poison");
  bVar1 = is_affected((CHAR_DATA *)vo,iVar2);
  if (bVar1) {
    switchD_002e4026::default((CHAR_DATA *)vo,iVar2);
    send_to_char("Your body stops wasting away.\n\r",(CHAR_DATA *)vo);
    act("$n\'s body stops wasting away.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    return;
  }
  bVar1 = is_affected(ch,sn_00);
  if (bVar1) {
LAB_002ba7de:
    act("$n looks better.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    send_to_char("You feel a warm sensation running through you.\n\r",(CHAR_DATA *)vo);
    switchD_002e4026::default((CHAR_DATA *)vo,sn_00);
    switchD_002e4026::default((CHAR_DATA *)vo,(int)gsn_poison_dust);
  }
  else {
    bVar1 = is_affected(ch,(int)gsn_poison_dust);
    if (bVar1) goto LAB_002ba7de;
  }
  bVar1 = is_affected(ch,(int)gsn_plague);
  if (bVar1) {
    act("The sores on $n\'s body disappear.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    send_to_char("The sores on your body disappear.\n\r",(CHAR_DATA *)vo);
    switchD_002e4026::default((CHAR_DATA *)vo,(int)gsn_plague);
  }
  send_to_char("You feel better!\n\r",(CHAR_DATA *)vo);
  iVar2 = *(int *)((long)vo + 0x158) + 100;
  if (*(short *)((long)vo + 0x15c) <= iVar2) {
    iVar2 = (int)*(short *)((long)vo + 0x15c);
  }
  *(int *)((long)vo + 0x158) = iVar2;
  if ((CHAR_DATA *)vo == ch) {
    return;
  }
  txt = "Ok.\n\r";
LAB_002ba89d:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_utter_heal(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int sn_atrophy, sn_poison;

	if (is_evil(ch))
	{
		send_to_char("The Gods of darkness do not grant such beneficial spells to their clerics.\n\r", ch);
		return;
	}

	sn_atrophy = skill_lookup("atrophy");
	sn_poison = skill_lookup("poison");

	if (is_affected(victim, sn_atrophy))
	{
		affect_strip(victim, sn_atrophy);
		send_to_char("Your body stops wasting away.\n\r", victim);
		act("$n's body stops wasting away.", victim, 0, 0, TO_ROOM);
		return;
	}

	if (is_affected(ch, sn_poison) || is_affected(ch, gsn_poison_dust))
	{
		act("$n looks better.", victim, 0, 0, TO_ROOM);
		send_to_char("You feel a warm sensation running through you.\n\r", victim);
		affect_strip(victim, sn_poison);
		affect_strip(victim, gsn_poison_dust);
	}

	if (is_affected(ch, gsn_plague))
	{
		act("The sores on $n's body disappear.", victim, 0, 0, TO_ROOM);
		send_to_char("The sores on your body disappear.\n\r", victim);
		affect_strip(victim, gsn_plague);
	}

	send_to_char("You feel better!\n\r", victim);

	victim->hit = std::min(victim->hit + 100, (int)victim->max_hit);

	if (victim != ch)
		send_to_char("Ok.\n\r", ch);
}